

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall
pbrt::HaltonSampler::HaltonSampler
          (HaltonSampler *this,int samplesPerPixel,Point2i fullRes,RandomizeStrategy randomize,
          int seed,Allocator alloc)

{
  Allocator alloc_00;
  int iVar1;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar2;
  int *piVar3;
  uint64_t uVar4;
  int in_ECX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  int exp;
  int scale;
  int base;
  int i;
  Point2<int> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_34;
  Tuple2<pbrt::Point2,_int> local_8;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_ECX;
  *(undefined8 *)(in_RDI + 2) = 0;
  Point2<int>::Point2(in_stack_ffffffffffffffa0);
  Point2<int>::Point2(in_stack_ffffffffffffffa0);
  *(undefined8 *)(in_RDI + 10) = 0;
  in_RDI[0xc] = 0;
  if (in_ECX == 1) {
    alloc_00.memoryResource._4_4_ = in_stack_ffffffffffffffc4;
    alloc_00.memoryResource._0_4_ = in_stack_ffffffffffffffc0;
    pvVar2 = ComputeRadicalInversePermutations((uint32_t)((ulong)in_RDI >> 0x20),alloc_00);
    *(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> **)
     (in_RDI + 2) = pvVar2;
  }
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    iVar1 = 3;
    if (local_34 == 0) {
      iVar1 = 2;
    }
    in_stack_ffffffffffffffb4 = 1;
    in_stack_ffffffffffffffb0 = 0;
    while( true ) {
      in_stack_ffffffffffffffac = in_stack_ffffffffffffffb4;
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,local_34);
      piVar3 = std::min<int>(piVar3,&MaxHaltonResolution);
      if (*piVar3 <= in_stack_ffffffffffffffb4) break;
      in_stack_ffffffffffffffb4 = iVar1 * in_stack_ffffffffffffffac;
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1;
    }
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[]
                       ((Tuple2<pbrt::Point2,_int> *)(in_RDI + 4),local_34);
    *piVar3 = in_stack_ffffffffffffffac;
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[]
                       ((Tuple2<pbrt::Point2,_int> *)(in_RDI + 6),local_34);
    *piVar3 = in_stack_ffffffffffffffb0;
  }
  Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 4),1);
  Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 4),0);
  uVar4 = multiplicativeInverse
                    (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI[8] = (int)uVar4;
  Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 4),0);
  Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 4),1);
  uVar4 = multiplicativeInverse
                    (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI[9] = (int)uVar4;
  return;
}

Assistant:

HaltonSampler::HaltonSampler(int samplesPerPixel, Point2i fullRes,
                             RandomizeStrategy randomize, int seed, Allocator alloc)
    : samplesPerPixel(samplesPerPixel), randomize(randomize) {
    if (randomize == RandomizeStrategy::PermuteDigits)
        digitPermutations = ComputeRadicalInversePermutations(seed, alloc);
    // Find radical inverse base scales and exponents that cover sampling area
    for (int i = 0; i < 2; ++i) {
        int base = (i == 0) ? 2 : 3;
        int scale = 1, exp = 0;
        while (scale < std::min(fullRes[i], MaxHaltonResolution)) {
            scale *= base;
            ++exp;
        }
        baseScales[i] = scale;
        baseExponents[i] = exp;
    }

    // Compute multiplicative inverses for _baseScales_
    multInverse[0] = multiplicativeInverse(baseScales[1], baseScales[0]);
    multInverse[1] = multiplicativeInverse(baseScales[0], baseScales[1]);
}